

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<45UL> * __thiscall GF2::WW<45ul>::operator=(WW<45UL> *this,WW<49UL> *wRight)

{
  unsigned_long *puVar1;
  long in_RSI;
  WW<45UL> *in_RDI;
  size_t pos;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    puVar1 = std::min<unsigned_long>(&WW<45UL>::_wcount,&WW<49UL>::_wcount);
    if (*puVar1 <= local_18) break;
    in_RDI[local_18]._words[0] = *(word *)(in_RSI + local_18 * 8);
    local_18 = local_18 + 1;
  }
  WW<45UL>::Trim(in_RDI);
  return in_RDI;
}

Assistant:

WW& operator=(const WW<_m>& wRight)
	{
		size_t pos = 0;
		for (; pos < std::min(_wcount, wRight._wcount); ++pos)
			_words[pos] = wRight._words[pos];
		if constexpr (_n < _m) 
			Trim();
		else 
			for (; pos < _wcount; _words[pos++] = 0);
		return *this;
	}